

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall
S2Builder::MaybeAddExtraSites
          (S2Builder *this,InputEdgeId edge_id,InputEdgeId max_edge_id,
          vector<int,_std::allocator<int>_> *chain,MutableS2ShapeIndex *input_edge_index,
          vector<int,_std::allocator<int>_> *snap_queue)

{
  S2Point *x;
  S2Point *y;
  S2Point *a1;
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  pointer piVar5;
  pointer pVVar6;
  pointer ppVar7;
  double dVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar13;
  S2Point *pSVar14;
  ulong uVar15;
  double *ap;
  double dVar16;
  double dVar17;
  S2Point new_site;
  S2Point new_site_1;
  S1ChordAngle local_90;
  S2Point local_88;
  S2Point local_68;
  S2Point local_48;
  
  pcVar4 = (this->edge_sites_).
           super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pcVar4[edge_id].super_compact_array_base<int,_std::allocator<int>_>.is_inlined_ == false) {
    paVar13 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
              pcVar4[edge_id].super_compact_array_base<int,_std::allocator<int>_>.field_7.pointer_;
  }
  else {
    paVar13 = &pcVar4[edge_id].super_compact_array_base<int,_std::allocator<int>_>.field_7;
  }
  uVar1 = *(uint *)&pcVar4[edge_id].super_compact_array_base<int,_std::allocator<int>_>;
  if ((uVar1 & 0xffffff) == 0) {
    return;
  }
  uVar15 = 0;
  uVar12 = 0;
  do {
    iVar2 = *(int *)((long)paVar13 + uVar15);
    piVar5 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    iVar3 = piVar5[(int)uVar12];
    if (iVar2 == iVar3) {
      uVar12 = uVar12 + 1;
      if ((long)(chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar5 >> 2 == (long)(int)uVar12) {
        return;
      }
      pVVar6 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      x = pVVar6 + iVar2;
      y = pVVar6 + piVar5[(int)uVar12];
      S1ChordAngle::S1ChordAngle(&local_90,x,y);
      if ((this->min_edge_length_to_split_ca_).length2_ <= local_90.length2_) {
        ppVar7 = (this->input_edges_).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar6 = (this->input_vertices_).
                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pSVar14 = pVVar6 + ppVar7[edge_id].first;
        a1 = pVVar6 + ppVar7[edge_id].second;
        bVar9 = S2::IsEdgeBNearEdgeA(pSVar14,a1,x,y,(S1Angle)(this->max_edge_deviation_).radians_);
        if (!bVar9) {
          S2::Project(&local_88,x,pSVar14,a1);
          S2::Project(&local_48,y,pSVar14,a1);
          local_68.c_[2] = local_88.c_[2] + local_48.c_[2];
          dVar16 = local_88.c_[0] + local_48.c_[0];
          dVar17 = local_88.c_[1] + local_48.c_[1];
          dVar8 = SQRT(dVar17 * dVar17 + dVar16 * dVar16 + local_68.c_[2] * local_68.c_[2]);
          dVar8 = (double)(~-(ulong)(dVar8 != 0.0) & (ulong)dVar8 |
                          (ulong)(1.0 / dVar8) & -(ulong)(dVar8 != 0.0));
          local_68.c_[2] = dVar8 * local_68.c_[2];
          local_68.c_[1]._0_4_ = SUB84(dVar8 * dVar17,0);
          local_68.c_[0] = dVar8 * dVar16;
          local_68.c_[1]._4_4_ = (int)((ulong)(dVar8 * dVar17) >> 0x20);
          pSVar14 = &local_88;
          GetSeparationSite(pSVar14,this,&local_68,x,y,edge_id);
          goto LAB_001ab193;
        }
      }
    }
    else if ((0 < (int)uVar12) && (this->num_forced_sites_ <= iVar2)) {
      pVVar6 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar14 = pVVar6 + iVar2;
      iVar2 = piVar5[(ulong)uVar12 - 1];
      iVar10 = s2pred::CompareEdgeDistance
                         (pSVar14,pVVar6 + iVar2,pVVar6 + iVar3,
                          (S1ChordAngle)(this->min_edge_site_separation_ca_).length2_);
      if (iVar10 < 0) {
        GetSeparationSite(&local_68,this,pSVar14,pVVar6 + iVar2,pVVar6 + iVar3,edge_id);
        lVar11 = 0;
        break;
      }
    }
    uVar15 = uVar15 + 4;
    if ((uVar1 & 0xffffff) << 2 == uVar15) {
      return;
    }
  } while( true );
  while (bVar9 = lVar11 != 0x10, lVar11 = lVar11 + 8, bVar9) {
    dVar8 = *(double *)((long)pSVar14->c_ + lVar11);
    dVar16 = *(double *)((long)local_68.c_ + lVar11);
    if ((dVar8 != dVar16) || (NAN(dVar8) || NAN(dVar16))) break;
  }
  if ((dVar8 == dVar16) && (!NAN(dVar8) && !NAN(dVar16))) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x351,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_88.c_[1],"Check failed: (site_to_avoid) != (new_site) ",0x2c);
    abort();
  }
  pSVar14 = &local_68;
LAB_001ab193:
  AddExtraSite(this,pSVar14,max_edge_id,input_edge_index,snap_queue);
  return;
}

Assistant:

void S2Builder::MaybeAddExtraSites(InputEdgeId edge_id,
                                   InputEdgeId max_edge_id,
                                   const vector<SiteId>& chain,
                                   const MutableS2ShapeIndex& input_edge_index,
                                   vector<InputEdgeId>* snap_queue) {
  // The snapped chain is always a *subsequence* of the nearby sites
  // (edge_sites_), so we walk through the two arrays in parallel looking for
  // sites that weren't snapped.  We also keep track of the current snapped
  // edge, since it is the only edge that can be too close.
  int i = 0;
  for (SiteId id : edge_sites_[edge_id]) {
    if (id == chain[i]) {
      if (++i == chain.size()) break;
      // Check whether this snapped edge deviates too far from its original
      // position.  If so, we split the edge by adding an extra site.
      const S2Point& v0 = sites_[chain[i - 1]];
      const S2Point& v1 = sites_[chain[i]];
      if (S1ChordAngle(v0, v1) < min_edge_length_to_split_ca_) continue;

      const InputEdge& edge = input_edges_[edge_id];
      const S2Point& a0 = input_vertices_[edge.first];
      const S2Point& a1 = input_vertices_[edge.second];
      if (!S2::IsEdgeBNearEdgeA(a0, a1, v0, v1, max_edge_deviation_)) {
        // Add a new site on the input edge, positioned so that it splits the
        // snapped edge into two approximately equal pieces.  Then we find all
        // the edges near the new site (including this one) and add them to
        // the snap queue.
        //
        // Note that with large snap radii, it is possible that the snapped
        // edge wraps around the sphere the "wrong way".  To handle this we
        // find the preferred split location by projecting both endpoints onto
        // the input edge and taking their midpoint.
        S2Point mid = (S2::Project(v0, a0, a1) +
                       S2::Project(v1, a0, a1)).Normalize();
        S2Point new_site = GetSeparationSite(mid, v0, v1, edge_id);
        AddExtraSite(new_site, max_edge_id, input_edge_index, snap_queue);
        return;
      }
    } else if (i > 0 && id >= num_forced_sites_) {
      // Check whether this "site to avoid" is closer to the snapped edge than
      // min_edge_vertex_separation().  Note that this is the only edge of the
      // chain that can be too close because its vertices must span the point
      // where "site_to_avoid" projects onto the input edge XY (this claim
      // relies on the fact that all sites are separated by at least the snap
      // radius).  We don't try to avoid sites added using ForceVertex()
      // because we don't guarantee any minimum separation from such sites.
      const S2Point& site_to_avoid = sites_[id];
      const S2Point& v0 = sites_[chain[i - 1]];
      const S2Point& v1 = sites_[chain[i]];
      if (s2pred::CompareEdgeDistance(
              site_to_avoid, v0, v1, min_edge_site_separation_ca_) < 0) {
        // A snapped edge can only approach a site too closely when there are
        // no sites near the input edge near that point.  We fix that by
        // adding a new site along the input edge (a "separation site"), then
        // we find all the edges near the new site (including this one) and
        // add them to the snap queue.
        S2Point new_site = GetSeparationSite(site_to_avoid, v0, v1, edge_id);
        S2_DCHECK_NE(site_to_avoid, new_site);
        AddExtraSite(new_site, max_edge_id, input_edge_index, snap_queue);
        return;
      }
    }
  }
}